

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O0

SourceLibrary * __thiscall
slang::driver::SourceLoader::getOrAddLibrary(SourceLoader *this,string_view name)

{
  bool bVar1;
  uint uVar2;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
  *this_00;
  pointer ppVar3;
  long in_RDI;
  mapped_type *lib;
  string nameStr;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
  *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  raw_key_type *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  allocator<char> *in_stack_fffffffffffffe00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
  *ptVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  try_emplace_args_t *in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe48;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
  *in_stack_fffffffffffffe50;
  allocator<char> local_1a1;
  undefined1 local_1a0 [40];
  basic_string_view<char,_std::char_traits<char>_> local_178;
  pointer local_168;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_160;
  undefined1 *local_148;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
  *local_140;
  undefined1 local_131;
  undefined1 *local_130;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
  *local_128;
  bool local_119 [25];
  iterator local_100;
  bool local_e9 [25];
  iterator local_d0;
  bool local_b9;
  iterator local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>
  local_a8;
  size_t local_90;
  size_t local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
  *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
  *local_8;
  
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_178);
  if (bVar1) {
    local_168 = (pointer)0x0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::allocator<char>::~allocator(&local_1a1);
    this_00 = (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
               *)(in_RDI + 0x50);
    local_148 = local_1a0;
    local_70 = &local_131;
    local_140 = this_00;
    local_130 = local_148;
    local_128 = this_00;
    local_78 = local_148;
    local_68 = this_00;
    local_80 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>>>
               ::key_from<std::__cxx11::string>(local_148);
    local_88 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>>>
               ::hash_for<std::__cxx11::string>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8)
    ;
    local_90 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
               ::position_for(in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8);
    local_10 = local_80;
    local_20 = local_88;
    ptVar4 = this_00;
    local_18 = local_90;
    local_8 = this_00;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_90);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
                 ::groups((table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
                           *)0x2611b8);
      local_40 = local_40 + local_38;
      uVar2 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                      CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                      (size_t)in_stack_fffffffffffffdd0);
      local_44 = uVar2;
      if (uVar2 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
                   ::elements((table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
                               *)0x26120d);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffde0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
               ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
                       *)0x26125d);
          in_stack_fffffffffffffde8 = local_10;
          in_stack_fffffffffffffdf0 =
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>>>
               ::
               key_from<std::pair<std::__cxx11::string_const,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>>
                         ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>
                           *)0x26128b);
          bVar1 = std::
                  equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x2612a6);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>
            ::table_locator(&local_a8,local_40,local_5c,local_58 + local_5c);
            goto LAB_00261392;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      in_stack_fffffffffffffddf =
           boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8);
      if ((bool)in_stack_fffffffffffffddf) {
        memset(&local_a8,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>
        ::table_locator(&local_a8);
        goto LAB_00261392;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,(this_00->arrays).groups_size_mask);
    } while (bVar1);
    memset(&local_a8,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>
    ::table_locator(&local_a8);
LAB_00261392:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_a8);
    if (bVar1) {
      local_b8 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
                 ::make_iterator((locator *)0x2613b4);
      local_b9 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_160,&local_b8,&local_b9);
    }
    else if ((ptVar4->size_ctrl).size < (ptVar4->size_ctrl).ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string_const&>
                (this_00,CONCAT44(uVar2,in_stack_fffffffffffffdf8),(size_t)in_stack_fffffffffffffdf0
                 ,(try_emplace_args_t *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      local_d0 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
                 ::make_iterator((locator *)0x26143e);
      local_e9[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_160,&local_d0,local_e9);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<slang::SourceLibrary,std::default_delete<slang::SourceLibrary>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string_const&>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38);
      local_100 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
                  ::make_iterator((locator *)0x2614ae);
      local_119[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_160,&local_100,local_119);
    }
    ppVar3 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                           *)in_stack_fffffffffffffdd0);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ppVar3->second;
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>
                        *)0x261511);
    if (!bVar1) {
      boost::unordered::
      unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
      ::size((unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
              *)0x261527);
      std::make_unique<slang::SourceLibrary,std::__cxx11::string,int>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar2,in_stack_fffffffffffffdf8),(int *)in_stack_fffffffffffffdf0);
      std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>::operator=
                ((unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_> *)
                 this_01,(unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>
                          *)in_stack_fffffffffffffdc8);
      std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>::~unique_ptr
                ((unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_> *)
                 in_stack_fffffffffffffde0);
    }
    local_168 = std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>::
                get((unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_> *)
                    this_01);
    std::__cxx11::string::~string(this_01);
  }
  return local_168;
}

Assistant:

SourceLibrary* SourceLoader::getOrAddLibrary(std::string_view name) {
    if (name.empty())
        return nullptr;

    auto nameStr = std::string(name);
    auto& lib = libraries[nameStr];
    if (!lib)
        lib = std::make_unique<SourceLibrary>(std::move(nameStr), (int)libraries.size());

    return lib.get();
}